

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleFromVoxels.h
# Opt level: O1

bool __thiscall
nanovdb::
TrilinearSampler<nanovdb::Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>>
::update<nanovdb::Vec3<float>>
          (TrilinearSampler<nanovdb::Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>>
           *this,Vec3<float> *xyz)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  ValueType *pVVar4;
  undefined8 in_RCX;
  long lVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  CoordType local_28;
  
  fVar1 = xyz->mVec[2];
  auVar3 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)xyz->mVec;
  auVar7 = vroundps_avx(auVar8,9);
  auVar8 = vsubps_avx(auVar8,auVar7);
  uVar2 = vmovlps_avx(auVar8);
  *(undefined8 *)xyz->mVec = uVar2;
  auVar8 = vmovshdup_avx(auVar7);
  local_28.mVec[2] = (int32_t)auVar3._0_4_;
  xyz->mVec[2] = fVar1 - auVar3._0_4_;
  lVar5 = ((ulong)(uint)(int)auVar8._0_4_ << 0x20) +
          CONCAT44((int)((ulong)in_RCX >> 0x20),(int)auVar7._0_4_);
  if (((int)auVar7._0_4_ == *(int *)(this + 8)) &&
     (local_28.mVec[1] = (int32_t)((ulong)lVar5 >> 0x20), local_28.mVec[1] == *(int *)(this + 0xc)))
  {
    bVar6 = *(int *)(this + 0x10) == local_28.mVec[2];
  }
  else {
    bVar6 = false;
  }
  if (bVar6 == false) {
    *(int32_t *)(this + 0x10) = local_28.mVec[2];
    *(long *)(this + 8) = lVar5;
    local_28.mVec._0_8_ = lVar5;
    pVVar4 = RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
             ::getValue((RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
                         *)(*(long *)this + *(long *)(*(long *)this + 0x18)),&local_28);
    *(ValueType *)(this + 0x14) = *pVVar4;
    local_28.mVec[2] = local_28.mVec[2] + 1;
    pVVar4 = RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
             ::getValue((RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
                         *)(*(long *)this + *(long *)(*(long *)this + 0x18)),&local_28);
    *(ValueType *)(this + 0x18) = *pVVar4;
    local_28.mVec[1] = local_28.mVec[1] + 1;
    pVVar4 = RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
             ::getValue((RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
                         *)(*(long *)this + *(long *)(*(long *)this + 0x18)),&local_28);
    *(ValueType *)(this + 0x20) = *pVVar4;
    local_28.mVec[2] = local_28.mVec[2] + -1;
    pVVar4 = RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
             ::getValue((RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
                         *)(*(long *)this + *(long *)(*(long *)this + 0x18)),&local_28);
    *(ValueType *)(this + 0x1c) = *pVVar4;
    auVar7._8_8_ = 0;
    auVar7._0_4_ = local_28.mVec[0];
    auVar7._4_4_ = local_28.mVec[1];
    auVar8 = vpaddd_avx(auVar7,_DAT_005e6ec0);
    local_28.mVec._0_8_ = auVar8._0_8_;
    pVVar4 = RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
             ::getValue((RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
                         *)(*(long *)this + *(long *)(*(long *)this + 0x18)),&local_28);
    *(ValueType *)(this + 0x24) = *pVVar4;
    local_28.mVec[2] = local_28.mVec[2] + 1;
    pVVar4 = RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
             ::getValue((RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
                         *)(*(long *)this + *(long *)(*(long *)this + 0x18)),&local_28);
    *(ValueType *)(this + 0x28) = *pVVar4;
    local_28.mVec[1] = local_28.mVec[1] + 1;
    pVVar4 = RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
             ::getValue((RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
                         *)(*(long *)this + *(long *)(*(long *)this + 0x18)),&local_28);
    *(ValueType *)(this + 0x30) = *pVVar4;
    local_28.mVec[2] = local_28.mVec[2] + -1;
    pVVar4 = RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
             ::getValue((RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
                         *)(*(long *)this + *(long *)(*(long *)this + 0x18)),&local_28);
    *(ValueType *)(this + 0x2c) = *pVVar4;
  }
  return (bool)(bVar6 ^ 1);
}

Assistant:

bool TrilinearSampler<TreeOrAccT>::update(Vec3T& xyz)
{
    CoordT ijk = Floor<CoordT>(xyz);

    if (ijk == mPos)
        return false; // early out - reuse cached values

    mPos = ijk;

    mVal[0][0][0] = mAcc->getValue(ijk); // i, j, k

    ijk[2] += 1;
    mVal[0][0][1] = mAcc->getValue(ijk); // i, j, k + 1

    ijk[1] += 1;
    mVal[0][1][1] = mAcc->getValue(ijk); // i, j+1, k + 1

    ijk[2] -= 1;
    mVal[0][1][0] = mAcc->getValue(ijk); // i, j+1, k

    ijk[0] += 1;
    ijk[1] -= 1;
    mVal[1][0][0] = mAcc->getValue(ijk); // i+1, j, k

    ijk[2] += 1;
    mVal[1][0][1] = mAcc->getValue(ijk); // i+1, j, k + 1

    ijk[1] += 1;
    mVal[1][1][1] = mAcc->getValue(ijk); // i+1, j+1, k + 1

    ijk[2] -= 1;
    mVal[1][1][0] = mAcc->getValue(ijk); // i+1, j+1, k

    return true;
}